

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.h
# Opt level: O0

bool __thiscall
ADS::Graph<unsigned_int>::isConnected(Graph<unsigned_int> *this,bool bStronglyConnected)

{
  bool bVar1;
  uint uVar2;
  Vertex<unsigned_int> *pVVar3;
  uint local_48;
  uint local_44;
  uint i;
  uint uiVertexKey;
  Vertex<unsigned_int> *pVertex;
  bool *pVisited;
  Graph<unsigned_int> *pGStack_28;
  bool bRet;
  Graph<unsigned_int> *pGraph;
  Graph<unsigned_int> *pGStack_18;
  bool bStronglyConnected_local;
  Graph<unsigned_int> *this_local;
  
  pGraph._7_1_ = bStronglyConnected;
  pGStack_18 = this;
  if ((bStronglyConnected) || (bVar1 = isDirected(this), !bVar1)) {
    pVertex = (Vertex<unsigned_int> *)allocateArray(this->_uiNVertexes,1);
    for (local_44 = 0; uVar2 = DArray<ADS::Vertex<unsigned_int>_*>::size(&this->_vertices),
        local_44 < uVar2; local_44 = local_44 + 1) {
      pVVar3 = DArray<ADS::Vertex<unsigned_int>_*>::get(&this->_vertices,local_44);
      if (pVVar3 != (Vertex<unsigned_int> *)0x0) {
        *(undefined1 *)((long)&pVertex->uiVertexKey + (ulong)local_44) = 1;
        traverse(this,pVVar3,(bool *)pVertex);
        for (local_48 = 0; local_48 < this->_uiNVertexes; local_48 = local_48 + 1) {
          pVVar3 = DArray<ADS::Vertex<unsigned_int>_*>::get(&this->_vertices,local_48);
          if ((pVVar3 != (Vertex<unsigned_int> *)0x0) &&
             ((*(byte *)((long)&pVertex->uiVertexKey + (ulong)local_48) & 1) == 0)) {
            deallocate(&pVertex);
            return false;
          }
        }
      }
      bVar1 = isDirected(this);
      if (!bVar1) break;
      setArray(0,pVertex,this->_uiNVertexes,1);
    }
    deallocate(&pVertex);
    this_local._7_1_ = true;
  }
  else {
    pGStack_28 = getUndirectedGraph(this);
    pVisited._7_1_ = isConnected(pGStack_28,(bool)(pGraph._7_1_ & 1));
    if (pGStack_28 != (Graph<unsigned_int> *)0x0) {
      (*pGStack_28->_vptr_Graph[1])();
    }
    this_local._7_1_ = (bool)(pVisited._7_1_ & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool Graph<T>::isConnected (bool bStronglyConnected)
    {
        if (!bStronglyConnected && isDirected()) {
            /* Get the underlying undirected graph and checks if
               that is connected */
            Graph *pGraph = getUndirectedGraph();
            bool bRet = pGraph->isConnected (bStronglyConnected);
            delete pGraph;
            return bRet;
        }

        /* Allocated array initializes all the elements to 0x0 */
        bool *pVisited = (bool *) allocateArray (_uiNVertexes, sizeof (bool));

        /* For each vertex */
        Vertex<T> *pVertex = NULL;
        unsigned int uiVertexKey = 0;
        for (; uiVertexKey < _vertices.size(); uiVertexKey++) {
            if ((pVertex = _vertices.get (uiVertexKey)) != NULL) {
                pVisited[uiVertexKey] = true;
                traverse (pVertex, pVisited);

                /* Checks whether all the vertices were visited */
                for (unsigned int i = 0; i < _uiNVertexes; i++)
                    if ((_vertices.get (i) != NULL) && !pVisited[i]) {
                        /* the vertex of key "i" exists and it was not visited */
                        deallocate ((void**)&pVisited);
                        return false;
                    }
            }
            if (!isDirected())
                /* if the graph is undirected, having 1 connected node is
                   a sufficient condition for the graph to be strongly connected
                   (and therefore not to be weakly connected as well */
                break;
            /* Reset array of visited nodes */
            setArray ((int)false, pVisited, _uiNVertexes, sizeof (bool));
        }

        deallocate ((void**)&pVisited);
        return true;
    }